

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  long lVar1;
  double dVar2;
  double dVar3;
  N_Vector_Ops p_Var4;
  sunrealtype *psVar5;
  N_Vector *pp_Var6;
  long *plVar7;
  sunrealtype sVar8;
  int iVar9;
  long lVar10;
  sunrealtype *psVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  sunrealtype *psVar19;
  ulong uVar20;
  ulong uVar21;
  double *pdVar22;
  ulong uVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined4 local_48;
  
  p_Var4 = kin_mem->kin_vtemp2->ops;
  if ((p_Var4->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) &&
     (p_Var4->nvdotprodmultilocal ==
      (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0)) {
    bVar24 = true;
  }
  else {
    bVar24 = p_Var4->nvdotprodmultiallreduce == (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0
    ;
  }
  psVar5 = kin_mem->kin_cv;
  pp_Var6 = kin_mem->kin_Xv;
  plVar7 = kin_mem->kin_ipt_map;
  lVar16 = (iter + -1) % kin_mem->kin_m_aa;
  N_VLinearSum(0,0xbff0000000000000,gval,xold,fv);
  if (0 < iter) {
    N_VLinearSum(0,0xbff0000000000000,gval,kin_mem->kin_gold_aa,kin_mem->kin_dg_aa[lVar16]);
    N_VLinearSum(0,0xbff0000000000000,fv,kin_mem->kin_fold_aa,kin_mem->kin_df_aa[lVar16]);
  }
  N_VScale(0,gval,kin_mem->kin_gold_aa);
  N_VScale(0,fv,kin_mem->kin_fold_aa);
  if (iter == 1) {
    dVar25 = (double)N_VDotProd(kin_mem->kin_df_aa[lVar16],kin_mem->kin_df_aa[lVar16]);
    dVar28 = 0.0;
    if (0.0 < dVar25) {
      dVar28 = (double)N_VDotProd(kin_mem->kin_df_aa[lVar16],kin_mem->kin_df_aa[lVar16]);
      if (dVar28 < 0.0) {
        dVar28 = sqrt(dVar28);
      }
      else {
        dVar28 = SQRT(dVar28);
      }
    }
    *R = dVar28;
    N_VScale(SUB84(1.0 / dVar28,0),kin_mem->kin_df_aa[lVar16],kin_mem->kin_q_aa[lVar16]);
    *plVar7 = 0;
  }
  else {
    if (iter == 0) {
      if (kin_mem->kin_damping_aa != 0) {
        iVar9 = N_VLinearSum(SUB84(1.0 - kin_mem->kin_beta,0),kin_mem->kin_beta_aa,xold,gval,x);
        return iVar9;
      }
      iVar9 = N_VScale(0,gval,x);
      return iVar9;
    }
    lVar15 = kin_mem->kin_m_aa;
    if (lVar15 < iter) {
      lVar17 = 0x10;
      psVar11 = R;
      lVar18 = 0;
      while( true ) {
        uVar21 = 1;
        lVar1 = lVar15 + -1;
        if (lVar1 <= lVar18) break;
        lVar1 = lVar18 + 1;
        lVar10 = lVar1 * lVar15;
        dVar25 = R[lVar10 + lVar18];
        dVar28 = R[lVar10 + lVar18 + 1];
        auVar26._8_8_ = dVar25;
        auVar26._0_8_ = dVar28;
        dVar25 = dVar25 * dVar25 + dVar28 * dVar28;
        sVar8 = (sunrealtype)(-(ulong)(0.0 < dVar25) & (ulong)SQRT(dVar25));
        R[lVar10 + lVar18] = sVar8;
        auVar27._8_4_ = SUB84(sVar8,0);
        auVar27._0_8_ = sVar8;
        auVar27._12_4_ = (int)((ulong)sVar8 >> 0x20);
        auVar27 = divpd(auVar26,auVar27);
        R[lVar10 + lVar18 + 1] = 0.0;
        dVar25 = auVar27._8_8_;
        dVar28 = -auVar27._0_8_;
        lVar13 = lVar15 * lVar17;
        for (lVar10 = lVar18 + 2; lVar10 < lVar15; lVar10 = lVar10 + 1) {
          dVar2 = *(double *)((long)psVar11 + lVar13);
          dVar3 = *(double *)((long)psVar11 + lVar13 + 8);
          *(double *)((long)psVar11 + lVar13) = dVar2 * dVar25 + dVar3 * auVar27._0_8_;
          ((double *)((long)psVar11 + lVar13))[1] = dVar2 * dVar28 + dVar3 * dVar25;
          lVar13 = lVar13 + lVar15 * 8;
        }
        N_VLinearSum(kin_mem->kin_q_aa[lVar18],kin_mem->kin_q_aa[lVar1],kin_mem->kin_vtemp2);
        local_48 = SUB84(dVar28,0);
        N_VLinearSum(local_48,dVar25,kin_mem->kin_q_aa[lVar18],kin_mem->kin_q_aa[lVar1]);
        N_VScale(0,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar18]);
        lVar15 = kin_mem->kin_m_aa;
        psVar11 = psVar11 + 1;
        lVar17 = lVar17 + 8;
        lVar18 = lVar1;
      }
      psVar11 = R;
      lVar17 = 0;
      if (0 < lVar1) {
        lVar17 = lVar1;
      }
      for (; psVar19 = psVar11, lVar18 = lVar17, (long)uVar21 < lVar15; uVar21 = uVar21 + 1) {
        while (lVar18 != 0) {
          *psVar19 = psVar19[lVar15];
          psVar19 = psVar19 + 1;
          lVar18 = lVar18 + -1;
        }
        psVar11 = psVar11 + lVar15;
      }
      if (kin_mem->kin_orth_aa == 1) {
        if (bVar24) {
          psVar11 = kin_mem->kin_T_aa;
          *psVar11 = 1.0;
          uVar21 = 1;
          while ((long)(uVar21 + 1) < lVar15) {
            N_VDotProdMulti(uVar21 & 0xffffffff,kin_mem->kin_q_aa[uVar21],kin_mem->kin_q_aa,
                            psVar11 + lVar15 * uVar21);
            psVar11 = kin_mem->kin_T_aa;
            lVar15 = kin_mem->kin_m_aa;
            psVar11[(lVar15 + 1) * uVar21] = 1.0;
            uVar21 = uVar21 + 1;
          }
        }
        else {
          if (1 < uVar21) {
            for (uVar21 = 2; (long)uVar21 < lVar15; uVar21 = uVar21 + 1) {
              N_VDotProdMultiLocal
                        (uVar21 & 0xffffffff,kin_mem->kin_q_aa[uVar21 - 1],kin_mem->kin_q_aa,
                         kin_mem->kin_T_aa + (uVar21 - 1) * lVar15);
              lVar15 = kin_mem->kin_m_aa;
            }
            N_VDotProdMultiAllReduce
                      ((int)lVar15 * (int)lVar15,kin_mem->kin_q_aa[uVar21 - 1],kin_mem->kin_T_aa);
            lVar15 = kin_mem->kin_m_aa;
          }
          lVar18 = 0;
          for (lVar17 = 1; lVar17 < lVar15; lVar17 = lVar17 + 1) {
            *(undefined8 *)((long)kin_mem->kin_T_aa + lVar18) = 0x3ff0000000000000;
            lVar18 = lVar18 + lVar15 * 8 + 8;
          }
        }
      }
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[lVar16],(int)lVar15 + -1,(int)lVar15,
                 kin_mem->kin_qr_data);
      plVar12 = plVar7;
      lVar15 = lVar16;
      while (lVar15 = lVar15 + 1, lVar15 < kin_mem->kin_m_aa) {
        *plVar12 = lVar15;
        plVar12 = plVar12 + 1;
      }
      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
        *plVar12 = lVar15;
        plVar12 = plVar12 + 1;
      }
    }
    else {
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[lVar16],(int)iter + -1,(int)lVar15,
                 kin_mem->kin_qr_data);
      lVar15 = 0;
      lVar16 = 0;
      if (0 < iter) {
        lVar16 = iter;
      }
      for (; lVar16 != lVar15; lVar15 = lVar15 + 1) {
        plVar7[lVar15] = lVar15;
      }
    }
  }
  if (kin_mem->kin_m_aa < iter) {
    iter = kin_mem->kin_m_aa;
  }
  iVar9 = N_VDotProdMulti(iter & 0xffffffff,fv,kin_mem->kin_q_aa,gamma);
  if (iVar9 != 0) {
    return iVar9;
  }
  *psVar5 = 1.0;
  *pp_Var6 = gval;
  lVar15 = iter * 8;
  psVar11 = R + (iter - 1);
  uVar21 = 1;
  uVar14 = 2;
  lVar16 = iter - 1;
  uVar20 = iter;
  for (lVar17 = lVar16; -1 < lVar17; lVar17 = lVar17 + -1) {
    lVar18 = kin_mem->kin_m_aa;
    dVar25 = gamma[lVar17];
    pdVar22 = (double *)(lVar18 * lVar15 + (long)psVar11);
    for (uVar23 = uVar20; (long)uVar23 < iter; uVar23 = uVar23 + 1) {
      dVar25 = dVar25 - *pdVar22 * gamma[uVar23];
      gamma[lVar17] = dVar25;
      pdVar22 = pdVar22 + lVar18;
    }
    dVar28 = R[(lVar18 + 1) * lVar17];
    gamma[lVar17] = dVar25 / dVar28;
    psVar5[uVar21] = -(dVar25 / dVar28);
    pp_Var6[uVar21] = kin_mem->kin_dg_aa[plVar7[lVar17]];
    uVar21 = uVar21 + 1;
    uVar14 = uVar14 + 1;
    uVar20 = uVar20 - 1;
    psVar11 = psVar11 + -1;
    lVar15 = lVar15 + -8;
  }
  if (kin_mem->kin_damping_aa != 0) {
    dVar25 = 1.0 - kin_mem->kin_beta_aa;
    psVar5[uVar21 & 0xffffffff] = -dVar25;
    pp_Var6[uVar21 & 0xffffffff] = fv;
    for (; uVar21 = uVar14, -1 < lVar16; lVar16 = lVar16 + -1) {
      psVar5[uVar14] = gamma[lVar16] * dVar25;
      pp_Var6[uVar14] = kin_mem->kin_df_aa[plVar7[lVar16]];
      uVar14 = uVar14 + 1;
    }
  }
  iVar9 = N_VLinearCombination(uVar21,psVar5,pp_Var6,x);
  return iVar9;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int i_pt, i, j, lAA;
  long int* ipt_map;
  sunrealtype alfa;
  sunrealtype onembeta;
  sunrealtype a, b, temp, c, s;
  sunbooleantype dotprodSB = SUNFALSE;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* local dot product flag for single buffer reductions */
  if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
       kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
      kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
  {
    dotprodSB = SUNTRUE;
  }

  ipt_map = kin_mem->kin_ipt_map;
  i_pt    = iter - 1 - ((iter - 1) / kin_mem->kin_m_aa) * kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -ONE, xold, fv);
  if (iter > 0)
  {
    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (iter == 0)
  {
    if (kin_mem->kin_damping_aa)
    {
      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta), xold, kin_mem->kin_beta_aa, gval,
                   x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }
    return (0);
  }

  /* update data structures based on current iteration index */

  if (iter == 1)
  {
    /* second iteration */
    R[0] =
      SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
    ipt_map[0] = 0;
  }
  else if (iter <= kin_mem->kin_m_aa)
  {
    /* another iteration before we've reached maa */

    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)iter - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* update iteration map */
    for (j = 0; j < iter; j++) { ipt_map[j] = j; }
  }
  else
  {
    /* we've filled the acceleration subspace, so start recycling */

    /* Delete left-most column vector from QR factorization */
    for (i = 0; i < kin_mem->kin_m_aa - 1; i++)
    {
      a    = R[(i + 1) * kin_mem->kin_m_aa + i];
      b    = R[(i + 1) * kin_mem->kin_m_aa + i + 1];
      temp = SUNRsqrt(a * a + b * b);
      c    = a / temp;
      s    = b / temp;
      R[(i + 1) * kin_mem->kin_m_aa + i]     = temp;
      R[(i + 1) * kin_mem->kin_m_aa + i + 1] = ZERO;
      /* OK to re-use temp */
      if (i < kin_mem->kin_m_aa - 1)
      {
        for (j = i + 2; j < kin_mem->kin_m_aa; j++)
        {
          a                                = R[j * kin_mem->kin_m_aa + i];
          b                                = R[j * kin_mem->kin_m_aa + i + 1];
          temp                             = c * a + s * b;
          R[j * kin_mem->kin_m_aa + i + 1] = -s * a + c * b;
          R[j * kin_mem->kin_m_aa + i]     = temp;
        }
      }
      N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_vtemp2);
      N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_q_aa[i + 1]);
      N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
    }

    /* Shift R to the left by one. */
    for (i = 1; i < kin_mem->kin_m_aa; i++)
    {
      for (j = 0; j < kin_mem->kin_m_aa - 1; j++)
      {
        R[(i - 1) * kin_mem->kin_m_aa + j] = R[i * kin_mem->kin_m_aa + j];
      }
    }

    /* If ICWY orthogonalization, then update T */
    if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (dotprodSB)
      {
        if (i > 1)
        {
          for (i = 2; i < kin_mem->kin_m_aa; i++)
          {
            N_VDotProdMultiLocal((int)i, kin_mem->kin_q_aa[i - 1],
                                 kin_mem->kin_q_aa,
                                 kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          }
          N_VDotProdMultiAllReduce((int)(kin_mem->kin_m_aa * kin_mem->kin_m_aa),
                                   kin_mem->kin_q_aa[i - 1], kin_mem->kin_T_aa);
        }
        for (i = 1; i < kin_mem->kin_m_aa; i++)
        {
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
      else
      {
        kin_mem->kin_T_aa[0] = ONE;
        for (i = 2; i < kin_mem->kin_m_aa; i++)
        {
          N_VDotProdMulti((int)i - 1, kin_mem->kin_q_aa[i - 1], kin_mem->kin_q_aa,
                          kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
    }

    /* Add the new df vector */
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)kin_mem->kin_m_aa - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* Update the iteration map */
    j = 0;
    for (i = i_pt + 1; i < kin_mem->kin_m_aa; i++) { ipt_map[j++] = i; }
    for (i = 0; i < (i_pt + 1); i++) { ipt_map[j++] = i; }
  }

  /* Solve least squares problem and update solution */
  lAA = iter;
  if (kin_mem->kin_m_aa < iter) { lAA = kin_mem->kin_m_aa; }

  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  for (i = lAA - 1; i > -1; i--)
  {
    for (j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[ipt_map[i]];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return 0;
}